

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

void __thiscall PSBTOutput::FillSignatureData(PSBTOutput *this,SignatureData *sigdata)

{
  XOnlyPubKey *this_00;
  _Base_ptr __args;
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  *this_01;
  uint uVar1;
  pointer ptVar2;
  uchar *puVar3;
  TaprootSpendData other;
  bool bVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  long lVar7;
  _Rb_tree_header *p_Var8;
  type *script;
  pointer ptVar9;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  Span<const_unsigned_char> script_00;
  TaprootSpendData spenddata;
  TaprootBuilder builder;
  SignatureData *pSVar10;
  undefined8 in_stack_fffffffffffffe70;
  _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
  *this_02;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 in_stack_fffffffffffffeb8 [32];
  TaprootSpendData local_118;
  TaprootBuilder local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->redeem_script).super_CScriptBase._size;
  uVar6 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar6 = uVar1;
  }
  if (uVar6 != 0) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(sigdata->redeem_script).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)this);
  }
  uVar1 = (this->witness_script).super_CScriptBase._size;
  uVar6 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar6 = uVar1;
  }
  if (uVar6 != 0) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(sigdata->witness_script).super_CScriptBase,
               &(this->witness_script).super_CScriptBase);
  }
  p_Var5 = (this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var8) {
    this_01 = &sigdata->misc_pubkeys;
    do {
      CPubKey::GetID((CKeyID *)&local_118,(CPubKey *)(p_Var5 + 1));
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
      ::_M_emplace_unique<CKeyID,std::pair<CPubKey_const,KeyOriginInfo>const&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
                  *)this_01,(CKeyID *)&local_118,(pair<const_CPubKey,_KeyOriginInfo> *)(p_Var5 + 1))
      ;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var8);
  }
  if ((this->m_tap_tree).
      super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_tap_tree).
      super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &this->m_tap_internal_key;
    bVar4 = XOnlyPubKey::IsFullyValid(this_00);
    if (bVar4) {
      local_a8.m_valid = true;
      local_a8.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_a8.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_a8.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      ptVar9 = (this->m_tap_tree).
               super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ptVar2 = (this->m_tap_tree).
               super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pSVar10 = sigdata;
      if (ptVar9 != ptVar2) {
        do {
          puVar3 = *(uchar **)
                    &(ptVar9->
                     super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ).
                     super__Tuple_impl<1UL,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     .
                     super__Tuple_impl<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     .
                     super__Head_base<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>
                     ._M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl;
          script_00.m_size =
               (long)*(pointer *)
                      ((long)&(ptVar9->
                              super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ).
                              super__Tuple_impl<1UL,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              .
                              super__Tuple_impl<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              .
                              super__Head_base<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>
                              ._M_head_impl.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl + 8) - (long)puVar3;
          script_00.m_data = puVar3;
          TaprootBuilder::Add(&local_a8,
                              (uint)(byte)(ptVar9->
                                          super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          ).
                                          super__Tuple_impl<1UL,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          .field_0x19,script_00,
                              (uint)(ptVar9->
                                    super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    ).
                                    super__Tuple_impl<1UL,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    .super__Head_base<1UL,_unsigned_char,_false>._M_head_impl,true);
          ptVar9 = ptVar9 + 1;
        } while (ptVar9 != ptVar2);
      }
      if (local_a8.m_valid == true) {
        lVar7 = (long)local_a8.m_branch.
                      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_a8.m_branch.
                      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6;
        if ((lVar7 == 0) ||
           ((lVar7 == 1 &&
            (((local_a8.m_branch.
               super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>)._M_payload.
             super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
             super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_engaged != false)))) {
          TaprootBuilder::Finalize(&local_a8,this_00);
          sigdata = pSVar10;
          TaprootBuilder::GetSpendData(&local_118,&local_a8);
          uVar11 = *(undefined8 *)(this_00->m_keydata).super_base_blob<256U>.m_data._M_elems;
          uVar12 = *(undefined8 *)
                    ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8)
          ;
          uVar13 = *(undefined8 *)
                    ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems +
                    0x18);
          *(undefined8 *)
           ((pSVar10->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems +
           0x10) = *(undefined8 *)
                    ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems +
                    0x10);
          *(undefined8 *)
           ((pSVar10->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems +
           0x18) = uVar13;
          *(undefined8 *)
           (pSVar10->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems =
               uVar11;
          *(undefined8 *)
           ((pSVar10->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 8
           ) = uVar12;
          uVar11 = local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_;
          uVar12 = local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_;
          uVar13 = local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_;
          uVar14 = local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_;
          uVar15 = local_118.merkle_root.super_base_blob<256U>.m_data._M_elems._0_8_;
          uVar16 = local_118.merkle_root.super_base_blob<256U>.m_data._M_elems._8_8_;
          uVar17 = local_118.merkle_root.super_base_blob<256U>.m_data._M_elems._16_8_;
          uVar18 = local_118.merkle_root.super_base_blob<256U>.m_data._M_elems._24_8_;
          std::
          _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                      *)&stack0xfffffffffffffeb8,&local_118.scripts._M_t);
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] =
               (char)in_stack_fffffffffffffe70;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] =
               (char)((ulong)in_stack_fffffffffffffe70 >> 8);
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] =
               (char)((ulong)in_stack_fffffffffffffe70 >> 0x10);
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] =
               (char)((ulong)in_stack_fffffffffffffe70 >> 0x18);
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] =
               (char)((ulong)in_stack_fffffffffffffe70 >> 0x20);
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] =
               (char)((ulong)in_stack_fffffffffffffe70 >> 0x28);
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] =
               (char)((ulong)in_stack_fffffffffffffe70 >> 0x30);
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] =
               (char)((ulong)in_stack_fffffffffffffe70 >> 0x38);
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = sigdata;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)uVar11;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = SUB81(uVar11,1)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = SUB81(uVar11,2)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = SUB81(uVar11,3)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = SUB81(uVar11,4)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = SUB81(uVar11,5)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = SUB81(uVar11,6)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = SUB81(uVar11,7)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar12;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = SUB81(uVar12,1)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = SUB81(uVar12,2)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = SUB81(uVar12,3)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = SUB81(uVar12,4)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = SUB81(uVar12,5)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = SUB81(uVar12,6)
          ;
          other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = SUB81(uVar12,7)
          ;
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0] = (uchar)uVar13;
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[1] = SUB81(uVar13,1);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[2] = SUB81(uVar13,2);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[3] = SUB81(uVar13,3);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[4] = SUB81(uVar13,4);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[5] = SUB81(uVar13,5);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[6] = SUB81(uVar13,6);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[7] = SUB81(uVar13,7);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[8] = (uchar)uVar14;
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[9] = SUB81(uVar14,1);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[10] = SUB81(uVar14,2);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0xb] = SUB81(uVar14,3);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0xc] = SUB81(uVar14,4);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0xd] = SUB81(uVar14,5);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0xe] = SUB81(uVar14,6);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0xf] = SUB81(uVar14,7);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)uVar15;
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x11] = SUB81(uVar15,1);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x12] = SUB81(uVar15,2);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x13] = SUB81(uVar15,3);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x14] = SUB81(uVar15,4);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x15] = SUB81(uVar15,5);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x16] = SUB81(uVar15,6);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x17] = SUB81(uVar15,7);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar16;
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x19] = SUB81(uVar16,1);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1a] = SUB81(uVar16,2);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1b] = SUB81(uVar16,3);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1c] = SUB81(uVar16,4);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1d] = SUB81(uVar16,5);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1e] = SUB81(uVar16,6);
          other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1f] = SUB81(uVar16,7);
          other.scripts._M_t._M_impl._0_1_ = (uchar)uVar17;
          other.scripts._M_t._M_impl._1_1_ = SUB81(uVar17,1);
          other.scripts._M_t._M_impl._2_1_ = SUB81(uVar17,2);
          other.scripts._M_t._M_impl._3_1_ = SUB81(uVar17,3);
          other.scripts._M_t._M_impl._4_1_ = SUB81(uVar17,4);
          other.scripts._M_t._M_impl._5_1_ = SUB81(uVar17,5);
          other.scripts._M_t._M_impl._6_1_ = SUB81(uVar17,6);
          other.scripts._M_t._M_impl._7_1_ = SUB81(uVar17,7);
          other.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = uVar18;
          other.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)in_stack_fffffffffffffeb8._0_8_;
          other.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)in_stack_fffffffffffffeb8._8_8_;
          other.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)in_stack_fffffffffffffeb8._16_8_;
          other.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count =
               in_stack_fffffffffffffeb8._24_8_;
          TaprootSpendData::Merge(&pSVar10->tr_spenddata,other);
          std::
          _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                       *)&stack0xfffffffffffffeb8);
          std::
          _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
          ::~_Rb_tree(&local_118.scripts._M_t);
          std::
          vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
          ::~vector(&local_a8.m_branch);
          goto LAB_0036a1ad;
        }
      }
      __assert_fail("builder.IsComplete()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/psbt.cpp"
                    ,0xf1,"void PSBTOutput::FillSignatureData(SignatureData &) const");
    }
  }
LAB_0036a1ad:
  p_Var5 = (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var8) {
    this_02 = (_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
               *)&sigdata->taproot_misc_pubkeys;
    do {
      __args = p_Var5 + 1;
      std::
      _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
      ::
      _M_emplace_unique<XOnlyPubKey_const&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>const&>
                (this_02,(XOnlyPubKey *)__args,
                 (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                  *)(p_Var5 + 2));
      local_a8.m_valid = false;
      local_a8._1_7_ = 0;
      local_a8.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_a8.m_branch.
                            super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      local_118.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_118.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      local_118.scripts._M_t._M_impl._0_8_ = 0;
      local_118.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_118.scripts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_118.merkle_root.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_118.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      local_118.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      CSHA256::CSHA256((CSHA256 *)&local_118);
      CSHA256::Write((CSHA256 *)&local_118,(uchar *)__args,0x20);
      output.m_size = 0x14;
      output.m_data = &local_a8.m_valid;
      CHash160::Finalize((CHash160 *)&local_118,output);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,XOnlyPubKey>,std::_Select1st<std::pair<CKeyID_const,XOnlyPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,XOnlyPubKey>>>
      ::_M_emplace_unique<uint160,XOnlyPubKey_const&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,XOnlyPubKey>,std::_Select1st<std::pair<CKeyID_const,XOnlyPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,XOnlyPubKey>>>
                  *)&sigdata->tap_pubkeys,(uint160 *)&local_a8,(XOnlyPubKey *)__args);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PSBTOutput::FillSignatureData(SignatureData& sigdata) const
{
    if (!redeem_script.empty()) {
        sigdata.redeem_script = redeem_script;
    }
    if (!witness_script.empty()) {
        sigdata.witness_script = witness_script;
    }
    for (const auto& key_pair : hd_keypaths) {
        sigdata.misc_pubkeys.emplace(key_pair.first.GetID(), key_pair);
    }
    if (!m_tap_tree.empty() && m_tap_internal_key.IsFullyValid()) {
        TaprootBuilder builder;
        for (const auto& [depth, leaf_ver, script] : m_tap_tree) {
            builder.Add((int)depth, script, (int)leaf_ver, /*track=*/true);
        }
        assert(builder.IsComplete());
        builder.Finalize(m_tap_internal_key);
        TaprootSpendData spenddata = builder.GetSpendData();

        sigdata.tr_spenddata.internal_key = m_tap_internal_key;
        sigdata.tr_spenddata.Merge(spenddata);
    }
    for (const auto& [pubkey, leaf_origin] : m_tap_bip32_paths) {
        sigdata.taproot_misc_pubkeys.emplace(pubkey, leaf_origin);
        sigdata.tap_pubkeys.emplace(Hash160(pubkey), pubkey);
    }
}